

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::PolymorphicEmitInfo::Init(PolymorphicEmitInfo *this,EmitInfo info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PolymorphicEmitInfo *this_local;
  EmitInfo info_local;
  
  this_local._4_4_ = info.type;
  if (this_local._4_4_ == Void) {
    this_local._0_4_ = info.super_EmitInfoBase.location;
    if (this_local._0_4_ != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x89b,"(info.location == Js::Constants::NoRegister)",
                         "info.location == Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this->count = 0;
    (this->field_1).infos = (EmitInfo *)0x0;
  }
  else {
    this->count = 1;
    (this->field_1).singleInfo = info;
  }
  return;
}

Assistant:

void PolymorphicEmitInfo::Init(EmitInfo info)
{
    if (info.type != WasmTypes::Void)
    {
        count = 1;
        singleInfo = info;
    }
    else
    {
        Assert(info.location == Js::Constants::NoRegister);
        count = 0;
        infos = nullptr;
    }
}